

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O2

bool __thiscall icu_63::RBBITableBuilder::findDuplicateState(RBBITableBuilder *this,IntPair *states)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  int index;
  void *pvVar5;
  void *pvVar6;
  IntPair *pIVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  
  iVar3 = this->fDStates->count;
  uVar4 = RBBISetBuilder::getNumCharCategories(this->fRB->fSetBuilder);
  iVar1 = iVar3 + -1;
  piVar2 = &states->second;
  if ((int)uVar4 < 1) {
    uVar4 = 0;
  }
  index = states->first;
  while (index < iVar1) {
    pvVar5 = UVector::elementAt(this->fDStates,index);
    pIVar7 = states;
    while( true ) {
      iVar10 = pIVar7->first + 1;
      states->second = iVar10;
      if (iVar3 <= iVar10) break;
      pvVar6 = UVector::elementAt(this->fDStates,iVar10);
      pIVar7 = (IntPair *)piVar2;
      if (((*(int *)((long)pvVar5 + 4) == *(int *)((long)pvVar6 + 4)) &&
          (*(int *)((long)pvVar5 + 8) == *(int *)((long)pvVar6 + 8))) &&
         (*(int *)((long)pvVar5 + 0x18) == *(int *)((long)pvVar6 + 0x18))) {
        uVar8 = 0;
        while( true ) {
          if (uVar4 == uVar8) goto LAB_00184b0a;
          iVar9 = 0;
          iVar10 = 0;
          if ((long)uVar8 < (long)*(int *)(*(long *)((long)pvVar5 + 0x28) + 8)) {
            iVar10 = *(int *)(*(long *)(*(long *)((long)pvVar5 + 0x28) + 0x18) + uVar8 * 4);
          }
          if ((long)uVar8 < (long)*(int *)(*(long *)((long)pvVar6 + 0x28) + 8)) {
            iVar9 = *(int *)(*(long *)(*(long *)((long)pvVar6 + 0x28) + 0x18) + uVar8 * 4);
          }
          if ((iVar10 != iVar9) &&
             (((iVar10 != states->first && (iVar10 != *piVar2)) ||
              ((iVar9 != states->first && (iVar9 != *piVar2)))))) break;
          uVar8 = uVar8 + 1;
        }
      }
    }
    index = states->first + 1;
    states->first = index;
  }
LAB_00184b0a:
  return index < iVar1;
}

Assistant:

bool RBBITableBuilder::findDuplicateState(IntPair *states) {
    int32_t numStates = fDStates->size();
    int32_t numCols = fRB->fSetBuilder->getNumCharCategories();

    for (; states->first<numStates-1; states->first++) {
        RBBIStateDescriptor *firstSD = (RBBIStateDescriptor *)fDStates->elementAt(states->first);
        for (states->second=states->first+1; states->second<numStates; states->second++) {
            RBBIStateDescriptor *duplSD = (RBBIStateDescriptor *)fDStates->elementAt(states->second);
            if (firstSD->fAccepting != duplSD->fAccepting ||
                firstSD->fLookAhead != duplSD->fLookAhead ||
                firstSD->fTagsIdx   != duplSD->fTagsIdx) {
                continue;
            }
            bool rowsMatch = true;
            for (int32_t col=0; col < numCols; ++col) {
                int32_t firstVal = firstSD->fDtran->elementAti(col);
                int32_t duplVal = duplSD->fDtran->elementAti(col);
                if (!((firstVal == duplVal) ||
                        ((firstVal == states->first || firstVal == states->second) &&
                        (duplVal  == states->first || duplVal  == states->second)))) {
                    rowsMatch = false;
                    break;
                }
            }
            if (rowsMatch) {
                return true;
            }
        }
    }
    return false;
}